

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O1

void __thiscall QImage::applyColorTransform(QImage *this,QColorTransform *transform)

{
  ColorModel CVar1;
  Format f;
  QColorTransformPrivate *pQVar2;
  QColorSpacePrivate *pQVar3;
  byte bVar4;
  bool bVar5;
  char cVar6;
  QRgb QVar7;
  pointer puVar8;
  QThreadPool *pQVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  code *pcVar12;
  uint uVar13;
  code *pcVar14;
  long lVar15;
  int iVar16;
  ColorModel CVar17;
  Format FVar18;
  QImageData *pQVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  QImage local_a0;
  undefined8 *local_88;
  QColorTransform *pQStack_80;
  QImageData *local_78;
  code *pcStack_70;
  undefined1 local_5c [4];
  anon_class_24_3_f0e105ae local_58;
  code *pcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = QColorTransform::isIdentity(transform);
  if (bVar5) goto LAB_0028eb06;
  pQVar19 = this->d;
  if (pQVar19 == (QImageData *)0x0) {
    uVar22 = 0;
  }
  else {
    uVar22 = (ulong)pQVar19->format;
  }
  uVar13 = (uint)pixelformats[uVar22].data & 0xf;
  bVar4 = 1;
  CVar17 = Rgb;
  switch(uVar13) {
  case 0:
  case 1:
  case 2:
    break;
  case 3:
    CVar17 = Gray;
    goto LAB_0028e559;
  case 4:
    CVar17 = Cmyk;
LAB_0028e559:
    bVar4 = 1;
    break;
  default:
    bVar4 = 0;
    CVar17 = Undefined;
  }
  pQVar2 = (transform->d).d.ptr;
  if (((uVar13 != 8) &&
      (CVar1 = ((pQVar2->colorSpaceIn).d.ptr)->colorModel,
      !(bool)(CVar1 != Undefined & bVar4 & CVar17 == CVar1))) && ((uVar13 != 3 || (CVar1 != Rgb))))
  goto LAB_0028e849;
  if (pQVar19 == (QImageData *)0x0) {
    uVar22 = 0;
  }
  else {
    uVar22 = (ulong)pQVar19->format;
  }
  uVar13 = (uint)pixelformats[uVar22].data & 0xf;
  bVar4 = 1;
  CVar17 = Rgb;
  switch(uVar13) {
  case 0:
  case 1:
  case 2:
    break;
  case 3:
    CVar17 = Gray;
    goto LAB_0028e5d1;
  case 4:
    CVar17 = Cmyk;
LAB_0028e5d1:
    bVar4 = 1;
    break;
  default:
    bVar4 = 0;
    CVar17 = Undefined;
  }
  if (((uVar13 != 8) &&
      (pQVar3 = (pQVar2->colorSpaceOut).d.ptr, CVar1 = pQVar3->colorModel,
      !(bool)(CVar1 != Undefined & bVar4 & CVar17 == CVar1))) &&
     ((uVar13 != 3 || (pQVar3->transformModel != ThreeComponentMatrix)))) {
LAB_0028e849:
    applyColorTransform();
    goto LAB_0028eb06;
  }
  detach(this);
  pQVar19 = this->d;
  if (pQVar19 == (QImageData *)0x0) goto LAB_0028eb06;
  if ((pixelformats[pQVar19->format].data & 0xf) == 2) {
    pQVar19 = this->d;
    if ((pQVar19->colortable).d.size != 0) {
      uVar22 = 0;
      do {
        puVar8 = QList<unsigned_int>::data(&pQVar19->colortable);
        QVar7 = QColorTransform::map(transform,puVar8[uVar22]);
        puVar8 = QList<unsigned_int>::data(&this->d->colortable);
        puVar8[uVar22] = QVar7;
        uVar22 = uVar22 + 1;
        pQVar19 = this->d;
      } while (uVar22 < (ulong)(pQVar19->colortable).d.size);
    }
    goto LAB_0028eb06;
  }
  f = pQVar19->format;
  if (f - Format_RGBX16FPx4 < 6) {
    uVar13 = f - Format_CMYK8888;
    FVar18 = Format_RGBA32FPx4;
LAB_0028e6a2:
    if (uVar13 < 0xfffffffd) {
LAB_0028e6a7:
      convertTo(this,FVar18,(ImageConversionFlags)0x0);
    }
  }
  else {
    if (0x20 < pQVar19->depth) {
      uVar13 = f - Format_Grayscale16;
      FVar18 = Format_RGBA64;
      goto LAB_0028e6a2;
    }
    if ((Format_CMYK8888 < f) || ((0x1011000070U >> ((ulong)f & 0x3f) & 1) == 0)) {
      FVar18 = Format_ARGB32;
      if (((pixelformats[pQVar19->format].data >> 0x28 & 1) != 0) &&
         ((((uint)pixelformats[pQVar19->format].data & 0xf) != 2 || ((pQVar19->field_0x70 & 4) == 0)
          ))) {
        FVar18 = Format_RGB32;
      }
      goto LAB_0028e6a7;
    }
  }
  local_5c = (undefined1  [4])0x0;
  pQVar19 = this->d;
  if (pQVar19 == (QImageData *)0x0) {
    FVar18 = Format_Invalid;
  }
  else {
    FVar18 = pQVar19->format;
  }
  if ((0x1213000010U >> ((ulong)FVar18 & 0x3f) & 1) == 0) {
    if ((0x404000020U >> ((ulong)FVar18 & 0x3f) & 1) == 0) {
      local_5c = (undefined1  [4])0x6;
    }
  }
  else {
    local_5c = (undefined1  [4])0x1;
  }
  local_88 = (undefined8 *)0x0;
  pQStack_80 = (QColorTransform *)0x0;
  local_78 = (QImageData *)0x0;
  pcStack_70 = (code *)0x0;
  local_58.this = this;
  local_58.transform = transform;
  if (pQVar19 == (QImageData *)0x0) {
LAB_0028e8b2:
    if (f == Format_CMYK8888) {
      local_58.flags = (TransformFlags *)local_5c;
      std::function<void(int,int)>::operator=((function<void(int,int)> *)&local_88,&local_58);
    }
    else {
      local_58.flags = (TransformFlags *)local_5c;
      std::function<void(int,int)>::operator=((function<void(int,int)> *)&local_88,&local_58);
    }
  }
  else if (pQVar19->format == Format_Grayscale8) {
    local_58.flags = (TransformFlags *)0x0;
    pcStack_40 = (code *)0x0;
    local_58.this = (QImage *)0x0;
    local_58.transform = (QColorTransform *)0x0;
    local_88 = (undefined8 *)operator_new(0x18);
    *local_88 = this;
    local_88[1] = transform;
    local_88[2] = local_5c;
    pcVar12 = std::
              _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5297:28)>
              ::_M_invoke;
    pcVar14 = std::
              _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5297:28)>
              ::_M_manager;
LAB_0028e7bf:
    pQStack_80 = local_58.transform;
    pQVar19 = local_78;
    local_58.this = (QImage *)0x0;
    local_58.transform = (QColorTransform *)0x0;
    local_58.flags = (TransformFlags *)local_78;
    pcStack_40 = pcStack_70;
    bVar5 = local_78 != (QImageData *)0x0;
    local_78 = (QImageData *)pcVar14;
    pcStack_70 = pcVar12;
    if (bVar5) {
      (*(code *)pQVar19)(&local_58,&local_58,3);
    }
  }
  else {
    if (pQVar19 == (QImageData *)0x0) goto LAB_0028e8b2;
    if (pQVar19->format == Format_Grayscale16) {
      local_58.flags = (TransformFlags *)0x0;
      pcStack_40 = (code *)0x0;
      local_58.this = (QImage *)0x0;
      local_58.transform = (QColorTransform *)0x0;
      local_88 = (undefined8 *)operator_new(0x18);
      *local_88 = this;
      local_88[1] = transform;
      local_88[2] = local_5c;
      pcVar12 = std::
                _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5304:28)>
                ::_M_invoke;
      pcVar14 = std::
                _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5304:28)>
                ::_M_manager;
      goto LAB_0028e7bf;
    }
    if (pQVar19 == (QImageData *)0x0) goto LAB_0028e8b2;
    if (pQVar19->format - Format_RGBX16FPx4 < 6) {
      local_58.flags = (TransformFlags *)local_5c;
      std::function<void(int,int)>::operator=((function<void(int,int)> *)&local_88,&local_58);
    }
    else {
      if ((pQVar19 == (QImageData *)0x0) || (pQVar19->depth < 0x21)) goto LAB_0028e8b2;
      local_58.flags = (TransformFlags *)local_5c;
      std::function<void(int,int)>::operator=((function<void(int,int)> *)&local_88,&local_58);
    }
  }
  pQVar19 = this->d;
  if (pQVar19 == (QImageData *)0x0) {
    lVar15 = 0;
  }
  else {
    lVar15 = (long)pQVar19->width;
  }
  uVar22 = 0;
  if (pQVar19 == (QImageData *)0x0) {
    lVar23 = 0;
  }
  else {
    lVar23 = (long)pQVar19->height;
  }
  if (pQVar19 != (QImageData *)0x0) {
    uVar22 = (ulong)(uint)pQVar19->height;
  }
  uVar20 = (ulong)(lVar23 * lVar15) >> 0x10 & 0xffffffff;
  if ((int)uVar22 < (int)((ulong)(lVar23 * lVar15) >> 0x10)) {
    uVar20 = uVar22;
  }
  pQVar9 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (pQVar9 == (QThreadPool *)0x0 || (int)uVar20 < 2) {
LAB_0028e958:
    if (this->d == (QImageData *)0x0) {
      local_a0.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0;
    }
    else {
      local_a0.super_QPaintDevice._vptr_QPaintDevice._0_4_ = this->d->height;
    }
    local_58.this = (QImage *)((ulong)local_58.this & 0xffffffff00000000);
    if (local_78 == (QImageData *)0x0) {
      std::__throw_bad_function_call();
    }
    (*pcStack_70)(&local_88,&local_58,&local_a0);
  }
  else {
    QThread::currentThread();
    cVar6 = QThreadPool::contains((QThread *)pQVar9);
    if (cVar6 != '\0') goto LAB_0028e958;
    local_58.this = (QImage *)&DAT_aaaaaaaaaaaaaaaa;
    iVar21 = 0;
    QSemaphore::QSemaphore((QSemaphore *)&local_58,0);
    do {
      iVar16 = 0;
      if (this->d != (QImageData *)0x0) {
        iVar16 = this->d->height;
      }
      iVar16 = (iVar16 - iVar21) / (int)uVar20;
      puVar10 = (undefined8 *)operator_new(0x18);
      *(undefined1 *)(puVar10 + 1) = 1;
      *puVar10 = QFactoryLoader::keyMap;
      puVar11 = (undefined8 *)operator_new(0x20);
      *puVar11 = QRunnable::QGenericRunnable::
                 Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/image/qimage.cpp:5349:31)>
                 ::impl;
      *(int *)(puVar11 + 1) = iVar21;
      *(int *)((long)puVar11 + 0xc) = iVar16;
      puVar11[2] = &local_88;
      puVar11[3] = &local_58;
      puVar10[2] = puVar11;
      QThreadPool::start((QRunnable *)pQVar9,(int)puVar10);
      iVar21 = iVar21 + iVar16;
      uVar13 = (int)uVar20 - 1;
      uVar20 = (ulong)uVar13;
    } while (uVar13 != 0);
    QSemaphore::acquire((int)&local_58);
    QSemaphore::~QSemaphore((QSemaphore *)&local_58);
  }
  if (this->d == (QImageData *)0x0) {
    FVar18 = Format_Invalid;
  }
  else {
    FVar18 = this->d->format;
  }
  if (f != FVar18) {
    convertToFormat(&local_a0,this,f,(ImageConversionFlags)0x0);
    local_58.flags = (TransformFlags *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.this = (QImage *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.transform = (QColorTransform *)&DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
    pQVar19 = local_a0.d;
    local_58.this = (QImage *)&PTR__QImage_007e2f38;
    local_a0.d = (QImageData *)0x0;
    local_58.flags = (TransformFlags *)this->d;
    this->d = pQVar19;
    ~QImage((QImage *)&local_58);
    ~QImage(&local_a0);
  }
  if (local_78 != (QImageData *)0x0) {
    (*(code *)local_78)(&local_88,&local_88,3);
  }
LAB_0028eb06:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QImage::applyColorTransform(const QColorTransform &transform)
{
    if (transform.isIdentity())
        return;

    if (!qt_compatibleColorModelSource(pixelFormat().colorModel(), QColorTransformPrivate::get(transform)->colorSpaceIn->colorModel) ||
        !qt_compatibleColorModelTarget(pixelFormat().colorModel(), QColorTransformPrivate::get(transform)->colorSpaceOut->colorModel,
                                       QColorTransformPrivate::get(transform)->colorSpaceOut->transformModel)) {
        qWarning() << "QImage::applyColorTransform can not apply format switching transform without switching format";
        return;
    }

    detach();
    if (!d)
        return;
    if (pixelFormat().colorModel() == QPixelFormat::Indexed) {
        for (int i = 0; i < d->colortable.size(); ++i)
            d->colortable[i] = transform.map(d->colortable[i]);
        return;
    }
    QImage::Format oldFormat = format();
    if (qt_fpColorPrecision(oldFormat)) {
        if (oldFormat != QImage::Format_RGBX32FPx4 && oldFormat != QImage::Format_RGBA32FPx4
                && oldFormat != QImage::Format_RGBA32FPx4_Premultiplied)
            convertTo(QImage::Format_RGBA32FPx4);
    } else if (depth() > 32) {
        if (oldFormat != QImage::Format_RGBX64 && oldFormat != QImage::Format_RGBA64
                && oldFormat != QImage::Format_RGBA64_Premultiplied)
            convertTo(QImage::Format_RGBA64);
    } else if (oldFormat != QImage::Format_ARGB32 && oldFormat != QImage::Format_RGB32
                && oldFormat != QImage::Format_ARGB32_Premultiplied && oldFormat != QImage::Format_CMYK8888
                && oldFormat != QImage::Format_Grayscale8 && oldFormat != QImage::Format_Grayscale16) {
        if (hasAlphaChannel())
            convertTo(QImage::Format_ARGB32);
        else
            convertTo(QImage::Format_RGB32);
    }

    QColorTransformPrivate::TransformFlags flags = QColorTransformPrivate::Unpremultiplied;
    switch (format()) {
    case Format_ARGB32_Premultiplied:
    case Format_RGBA64_Premultiplied:
    case Format_RGBA32FPx4_Premultiplied:
        flags = QColorTransformPrivate::Premultiplied;
        break;
    case Format_Grayscale8:
    case Format_Grayscale16:
    case Format_RGB32:
    case Format_CMYK8888:
    case Format_RGBX64:
    case Format_RGBX32FPx4:
        flags = QColorTransformPrivate::InputOpaque;
        break;
    case Format_ARGB32:
    case Format_RGBA64:
    case Format_RGBA32FPx4:
        break;
    default:
        Q_UNREACHABLE();
    }

    std::function<void(int,int)> transformSegment;

    if (format() == Format_Grayscale8) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                uint8_t *scanline = reinterpret_cast<uint8_t *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (format() == Format_Grayscale16) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                uint16_t *scanline = reinterpret_cast<uint16_t *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (qt_fpColorPrecision(format())) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgbaFloat32 *scanline = reinterpret_cast<QRgbaFloat32 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else  if (depth() > 32) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgba64 *scanline = reinterpret_cast<QRgba64 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (oldFormat == QImage::Format_CMYK8888) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QCmyk32 *scanline = reinterpret_cast<QCmyk32 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgb *scanline = reinterpret_cast<QRgb *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    }

#if QT_CONFIG(qtgui_threadpool)
    int segments = (qsizetype(width()) * height()) >> 16;
    segments = std::min(segments, height());
    QThreadPool *threadPool = QGuiApplicationPrivate::qtGuiThreadPool();
    if (segments > 1 && threadPool && !threadPool->contains(QThread::currentThread())) {
        QSemaphore semaphore;
        int y = 0;
        for (int i = 0; i < segments; ++i) {
            int yn = (height() - y) / (segments - i);
            threadPool->start([&, y, yn]() {
                transformSegment(y, y + yn);
                semaphore.release(1);
            });
            y += yn;
        }
        semaphore.acquire(segments);
    } else
#endif
        transformSegment(0, height());

    if (oldFormat != format())
        *this = std::move(*this).convertToFormat(oldFormat);
}